

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O1

double __thiscall fasttext::Meter::log(Meter *this,double __x)

{
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *this_00;
  float *__k;
  uint64_t *puVar1;
  float *pfVar2;
  key_type *pkVar3;
  undefined1 auVar4 [16];
  mapped_type *pmVar5;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var6;
  __normal_iterator<const_std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var7;
  undefined8 *in_RDX;
  const_iterator __end1;
  const_iterator __begin1;
  float *pfVar8;
  ulong *in_RSI;
  int *label;
  key_type *__k_00;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [64];
  undefined1 extraout_var [60];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  real gold;
  real score;
  Predictions *__range1;
  float local_44;
  double local_40;
  undefined8 *local_38;
  
  this->nexamples_ = this->nexamples_ + 1;
  pfVar8 = (float *)*in_RDX;
  pfVar2 = (float *)in_RDX[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = in_RSI[1];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = pfVar2;
  auVar4 = vpunpcklqdq_avx(auVar9,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *in_RSI;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = pfVar8;
  auVar9 = vpunpcklqdq_avx(auVar13,auVar14);
  auVar4 = vpsubq_avx(auVar4,auVar9);
  auVar9 = vpsravq_avx512vl(auVar4,_DAT_00143790);
  auVar4._0_8_ = (this->metrics_).gold;
  auVar4._8_8_ = (this->metrics_).predicted;
  auVar4 = vpaddq_avx(auVar9,auVar4);
  auVar11 = ZEXT1664(auVar4);
  (this->metrics_).gold = auVar4._0_8_;
  (this->metrics_).predicted = auVar4._8_8_;
  local_38 = in_RDX;
  if (pfVar8 != pfVar2) {
    this_00 = &this->labelMetrics_;
    do {
      __k = pfVar8 + 1;
      pmVar5 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)__k);
      pmVar5->predicted = pmVar5->predicted + 1;
      auVar11._0_4_ = expf(*pfVar8);
      auVar11._4_60_ = extraout_var;
      auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar11._0_16_);
      auVar11 = ZEXT1664(auVar4);
      local_40 = (double)CONCAT44(local_40._4_4_,auVar4._0_4_);
      local_44 = 0.0;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (*in_RSI,in_RSI[1],__k);
      if (_Var6._M_current != (int *)in_RSI[1]) {
        pmVar5 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,(key_type *)__k);
        pmVar5->predictedGold = pmVar5->predictedGold + 1;
        puVar1 = &(this->metrics_).predictedGold;
        *puVar1 = *puVar1 + 1;
        local_44 = 1.0;
      }
      pmVar5 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)__k);
      std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
      emplace_back<float&,float&>
                ((vector<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)
                 &pmVar5->scoreVsTrue,(float *)&local_40,&local_44);
      pfVar8 = pfVar8 + 2;
    } while (pfVar8 != pfVar2);
  }
  dVar10 = auVar11._0_8_;
  __k_00 = (key_type *)*in_RSI;
  pkVar3 = (key_type *)in_RSI[1];
  if (__k_00 != pkVar3) {
    do {
      pmVar5 = std::__detail::
               _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->labelMetrics_,__k_00);
      pmVar5->gold = pmVar5->gold + 1;
      if (this->falseNegativeLabels_ == true) {
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::pair<float,int>const*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,__gnu_cxx::__ops::_Iter_pred<fasttext::utils::containsSecond<float,int>(std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>const&,int_const&)::_lambda(std::pair<float,int>const&)_1_>>
                          (*local_38,local_38[1],__k_00);
        if (_Var7._M_current == (pair<float,_int> *)local_38[1]) {
          pmVar5 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->labelMetrics_,__k_00);
          local_40 = 1.0;
          std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
          emplace_back<float_const&,double>
                    ((vector<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)
                     &pmVar5->scoreVsTrue,(float *)&falseNegativeScore,&local_40);
        }
      }
      dVar10 = auVar11._0_8_;
      __k_00 = __k_00 + 1;
    } while (__k_00 != pkVar3);
  }
  return dVar10;
}

Assistant:

void Meter::log(
    const std::vector<int32_t>& labels,
    const Predictions& predictions) {
  nexamples_++;
  metrics_.gold += labels.size();
  metrics_.predicted += predictions.size();

  for (const auto& prediction : predictions) {
    labelMetrics_[prediction.second].predicted++;

    real score = std::min(std::exp(prediction.first), 1.0f);
    real gold = 0.0;
    if (utils::contains(labels, prediction.second)) {
      labelMetrics_[prediction.second].predictedGold++;
      metrics_.predictedGold++;
      gold = 1.0;
    }
    labelMetrics_[prediction.second].scoreVsTrue.emplace_back(score, gold);
  }

  for (const auto& label : labels) {
    labelMetrics_[label].gold++;
    if (falseNegativeLabels_) {
      if (!utils::containsSecond(predictions, label)) {
        labelMetrics_[label].scoreVsTrue.emplace_back(falseNegativeScore, 1.0);
      }
    }
  }
}